

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MaterialSystem.cpp
# Opt level: O2

aiReturn __thiscall aiMaterial::RemoveProperty(aiMaterial *this,char *pKey,uint type,uint index)

{
  uint uVar1;
  aiMaterialProperty **ppaVar2;
  aiMaterialProperty *this_00;
  int iVar3;
  ulong uVar4;
  uint uVar5;
  uint i;
  ulong uVar6;
  
  if (pKey == (char *)0x0) {
    __assert_fail("nullptr != pKey",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/Material/MaterialSystem.cpp"
                  ,0x1bb,
                  "aiReturn aiMaterial::RemoveProperty(const char *, unsigned int, unsigned int)");
  }
  uVar1 = this->mNumProperties;
  ppaVar2 = this->mProperties;
  uVar6 = 0;
  do {
    if (uVar1 == uVar6) goto LAB_00134733;
    this_00 = ppaVar2[uVar6];
    if (this_00 != (aiMaterialProperty *)0x0) {
      iVar3 = strcmp((this_00->mKey).data,pKey);
      if (((iVar3 == 0) && (this_00->mSemantic == type)) && (this_00->mIndex == index)) {
        aiMaterialProperty::~aiMaterialProperty(this_00);
        operator_delete(this_00);
        uVar5 = this->mNumProperties - 1;
        this->mNumProperties = uVar5;
        for (uVar4 = uVar6; uVar4 < uVar5; uVar4 = uVar4 + 1) {
          this->mProperties[uVar4] = this->mProperties[uVar4 + 1];
          uVar5 = this->mNumProperties;
        }
LAB_00134733:
        return (uint)(uVar6 < uVar1) + aiReturn_FAILURE;
      }
    }
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

aiReturn aiMaterial::RemoveProperty ( const char* pKey,unsigned int type, unsigned int index )
{
    ai_assert( nullptr != pKey );

    for (unsigned int i = 0; i < mNumProperties;++i) {
        aiMaterialProperty* prop = mProperties[i];

        if (prop && !strcmp( prop->mKey.data, pKey ) &&
            prop->mSemantic == type && prop->mIndex == index)
        {
            // Delete this entry
            delete mProperties[i];

            // collapse the array behind --.
            --mNumProperties;
            for (unsigned int a = i; a < mNumProperties;++a)    {
                mProperties[a] = mProperties[a+1];
            }
            return AI_SUCCESS;
        }
    }

    return AI_FAILURE;
}